

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O1

int root_recv_buffer(int sock,int *op,char *buffer,int buflen)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char recbuf [1200];
  uint local_4ec;
  undefined1 local_4e8 [1208];
  
  iVar2 = NET_RecvRaw(sock,&local_4ec,4);
  iVar3 = iVar2;
  if (-1 < iVar2) {
    local_4ec = (local_4ec >> 0x18 | (local_4ec & 0xff0000) >> 8 | (local_4ec & 0xff00) << 8 |
                local_4ec << 0x18) - 4;
    iVar3 = NET_RecvRaw(sock,op,4);
    if (-1 < iVar3) {
      uVar1 = *op;
      *op = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      if (0x4b0 < (int)local_4ec) {
        local_4ec = 0x4b0;
      }
      iVar4 = iVar3;
      if (0 < (int)local_4ec) {
        iVar4 = NET_RecvRaw(sock,local_4e8,local_4ec);
        if (4 < (int)local_4ec) {
          local_4ec = 4;
        }
        memcpy(buffer,local_4e8,(long)(int)local_4ec);
        if (iVar4 < 0) {
          return iVar4;
        }
      }
      iVar3 = iVar4 + iVar3 + iVar2;
    }
  }
  return iVar3;
}

Assistant:

static int root_recv_buffer(int sock, int *op, char *buffer, int buflen)
{
  /* recv a buffer, the form is
     <len>
     <op>
     <buffer>
  */

  int recv1 = 0;
  int len;
  int status;
  char recbuf[MAXLEN];

  status = NET_RecvRaw(sock,&len,4);

  if (status < 0) {
    return status;
  }
  recv1 += status;

  len = ntohl(len);

  /* ok, have the length, recive the operation */
  len -= 4;
  status = NET_RecvRaw(sock,op,4);
  if (status < 0) {
    return status;
  }

  recv1 += status;

  *op = ntohl(*op);
  
  if (len > MAXLEN) {
    len = MAXLEN;
  }

  if (len > 0) { /* Get the rest of the message */
    status = NET_RecvRaw(sock,recbuf,len);
    if (len > buflen) {
      len = buflen;
    }
    memcpy(buffer,recbuf,len);
    if (status < 0) {
      return status;
    }
  } 

  recv1 += status;
  return recv1;

}